

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O3

error __thiscall video::src_format<37,48>(video *this,context *ctx,token *token,opcode *op)

{
  _Storage<unsigned_long,_true> _Var1;
  ulong uVar2;
  ulong uVar3;
  string_view prefix;
  string_view prefix_00;
  optional<unsigned_long> oVar4;
  token local_58;
  
  uVar2 = 0x1000000000000;
  prefix._M_str = ".";
  prefix._M_len = 1;
  oVar4 = find_in_table(token,src_format<37,_48>::signed_table,prefix);
  _Var1._M_value =
       oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  if (((undefined1  [16])
       oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    prefix_00._M_str = ".";
    prefix_00._M_len = 1;
    oVar4 = find_in_table(token,src_format<37,_48>::unsigned_table,prefix_00);
    _Var1._M_value =
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    if (((undefined1  [16])
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
        (undefined1  [16])0x0) {
      uVar3 = 0x6000000000;
      goto LAB_0012885a;
    }
    uVar2 = 0;
  }
  context::tokenize(&local_58,ctx);
  token->column = local_58.column;
  (token->data).string._M_str = local_58.data.string._M_str;
  token->type = local_58.type;
  token->line = local_58.line;
  token->filename = local_58.filename;
  (token->data).predicate = local_58.data.predicate;
  uVar3 = _Var1._M_value << 0x25;
LAB_0012885a:
  if ((op->value & uVar3) == 0) {
    uVar3 = op->value | uVar3;
    op->value = uVar3;
    if ((uVar3 & uVar2) == 0) {
      op->value = uVar3 | uVar2;
      *(undefined8 *)this = 0;
      return (unique_ptr<char[],_std::default_delete<char[]>_>)
             (unique_ptr<char[],_std::default_delete<char[]>_>)this;
    }
  }
  __assert_fail("(value & bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                ,0x31,"void opcode::add_bits(uint64_t)");
}

Assistant:

DEFINE_OPERAND(src_format)
    {
        static const char* signed_table[] = {"S8", "", "S16", "S32", nullptr};
        static const char* unsigned_table[] = {"U8", "", "U16", "U32", nullptr};
        bool is_signed = true;
        std::optional<int64_t> result = find_in_table(token, signed_table, ".");
        if (!result) {
            is_signed = false;
            result = find_in_table(token, unsigned_table, ".");
            if (!result) {
                is_signed = true;
            }
        }
        if (result) {
            token = ctx.tokenize();
        }
        op.add_bits(result.value_or(3) << address); // .U32
        op.add_bits((is_signed ? 1ULL : 0ULL) << sign_address);
        return {};
    }